

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

int Acb_DeriveCnfFromTruth(word Truth,int nVars,Vec_Int_t *vCover,Vec_Str_t *vCnf)

{
  uint __line;
  int iVar1;
  int iVar2;
  int i;
  char *__assertion;
  byte bVar3;
  long lVar4;
  int Var;
  int local_50;
  word Truth_local;
  Vec_Int_t *local_40;
  long local_38;
  
  vCnf->nSize = 0;
  Truth_local = Truth;
  if (Truth + 1 < 2) {
    Vec_StrPush(vCnf,Truth == 0);
    Vec_StrPush(vCnf,-1);
    local_50 = 1;
  }
  else {
    if (nVars < 1) {
      __assertion = "nVars > 0";
      __line = 0x42;
LAB_0030f0ad:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,__line,"int Acb_DeriveCnfFromTruth(word, int, Vec_Int_t *, Vec_Str_t *)");
    }
    local_50 = 0;
    local_40 = vCover;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      Truth_local = Truth_local ^ -lVar4;
      iVar1 = Kit_TruthIsop((uint *)&Truth_local,nVars,vCover,0);
      if (iVar1 != 0) {
        __assertion = "RetValue == 0";
        __line = 0x47;
        goto LAB_0030f0ad;
      }
      iVar1 = vCover->nSize;
      local_50 = local_50 + iVar1;
      local_38 = lVar4;
      for (i = 0; i < iVar1; i = i + 1) {
        iVar1 = Vec_IntEntry(vCover,i);
        bVar3 = 0;
        for (Var = 0; lVar4 = local_38, nVars != Var; Var = Var + 1) {
          switch(iVar1 >> (bVar3 & 0x1f) & 3) {
          case 0:
            goto switchD_0030f01d_caseD_0;
          case 1:
            iVar2 = 0;
            break;
          case 2:
            iVar2 = 1;
            break;
          case 3:
            __assertion = "0";
            __line = 0x53;
            goto LAB_0030f0ad;
          }
          iVar2 = Abc_Var2Lit(Var,iVar2);
          Vec_StrPush(vCnf,(char)iVar2);
switchD_0030f01d_caseD_0:
          bVar3 = bVar3 + 2;
        }
        iVar1 = Abc_Var2Lit(nVars,(int)local_38);
        Vec_StrPush(vCnf,(char)iVar1);
        Vec_StrPush(vCnf,-1);
        iVar1 = local_40->nSize;
        vCover = local_40;
      }
    }
  }
  return local_50;
}

Assistant:

int Acb_DeriveCnfFromTruth( word Truth, int nVars, Vec_Int_t * vCover, Vec_Str_t * vCnf )
{
    Vec_StrClear( vCnf );
    if ( Truth == 0 || ~Truth == 0 )
    {
//        assert( nVars == 0 );
        Vec_StrPush( vCnf, (char)(Truth == 0) );
        Vec_StrPush( vCnf, (char)-1 );
        return 1;
    }
    else 
    {
        int i, k, c, RetValue, Literal, Cube, nCubes = 0;
        assert( nVars > 0 );
        for ( c = 0; c < 2; c ++ )
        {
            Truth = c ? ~Truth : Truth;
            RetValue = Kit_TruthIsop( (unsigned *)&Truth, nVars, vCover, 0 );
            assert( RetValue == 0 );
            nCubes += Vec_IntSize( vCover );
            Vec_IntForEachEntry( vCover, Cube, i )
            {
                for ( k = 0; k < nVars; k++ )
                {
                    Literal = 3 & (Cube >> (k << 1));
                    if ( Literal == 1 )      // '0'  -> pos lit
                        Vec_StrPush( vCnf, (char)Abc_Var2Lit(k, 0) );
                    else if ( Literal == 2 ) // '1'  -> neg lit
                        Vec_StrPush( vCnf, (char)Abc_Var2Lit(k, 1) );
                    else if ( Literal != 0 )
                        assert( 0 );
                }
                Vec_StrPush( vCnf, (char)Abc_Var2Lit(nVars, c) );
                Vec_StrPush( vCnf, (char)-1 );
            }
        }
        return nCubes;
    }
}